

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.c
# Opt level: O0

void applyPbndCond(double **P,lattice *grid,char **FLAG)

{
  byte bVar1;
  long in_RDX;
  double *in_RSI;
  long *in_RDI;
  double dVar2;
  double dVar3;
  int j_2;
  int i_2;
  int delOW;
  int delNS;
  double denom;
  double num;
  double dySqrd;
  double dxSqrd;
  int i_1;
  int i;
  int j_1;
  int j;
  char flag;
  int local_60;
  int local_5c;
  double local_48;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  
  if (((ulong)in_RSI[5] & 4) != 0) {
    for (local_20 = 1; local_20 <= *(int *)((long)in_RSI + 0x24); local_20 = local_20 + 1) {
      *(undefined8 *)(*in_RDI + (long)local_20 * 8) =
           *(undefined8 *)(in_RDI[1] + (long)local_20 * 8);
    }
  }
  if (((ulong)in_RSI[5] & 8) != 0) {
    for (local_24 = 1; local_24 <= *(int *)((long)in_RSI + 0x24); local_24 = local_24 + 1) {
      *(undefined8 *)(in_RDI[*(int *)(in_RSI + 4) + 1] + (long)local_24 * 8) =
           *(undefined8 *)(in_RDI[*(int *)(in_RSI + 4)] + (long)local_24 * 8);
    }
  }
  if (((ulong)in_RSI[5] & 2) != 0) {
    for (local_28 = 1; local_28 <= *(int *)(in_RSI + 4); local_28 = local_28 + 1) {
      *(undefined8 *)in_RDI[local_28] = *(undefined8 *)(in_RDI[local_28] + 8);
    }
  }
  if (((ulong)in_RSI[5] & 1) != 0) {
    for (local_2c = 1; local_2c <= *(int *)(in_RSI + 4); local_2c = local_2c + 1) {
      *(undefined8 *)(in_RDI[local_2c] + (long)(*(int *)((long)in_RSI + 0x24) + 1) * 8) =
           *(undefined8 *)(in_RDI[local_2c] + (long)*(int *)((long)in_RSI + 0x24) * 8);
    }
  }
  dVar2 = sqr(*in_RSI);
  dVar3 = sqr(in_RSI[1]);
  for (local_5c = 1; local_5c <= *(int *)(in_RSI + 4); local_5c = local_5c + 1) {
    for (local_60 = 1; local_60 <= *(int *)((long)in_RSI + 0x24); local_60 = local_60 + 1) {
      bVar1 = *(byte *)(*(long *)(in_RDX + (long)local_5c * 8) + (long)local_60);
      if ((bVar1 & 0xf) != 0xf) {
        local_48 = 0.0;
        if ((bVar1 & 5) != 0) {
          local_48 = *(double *)
                      (in_RDI[local_5c] +
                      (long)(int)(local_60 + ((uint)((bVar1 & 1) != 0) - (uint)((bVar1 & 4) != 0)))
                      * 8) * dVar2 + 0.0;
        }
        if ((bVar1 & 10) != 0) {
          local_48 = *(double *)
                      (in_RDI[(int)(local_5c + ((uint)((bVar1 & 2) != 0) - (uint)((bVar1 & 8) != 0))
                                   )] + (long)local_60 * 8) * dVar3 + local_48;
        }
        *(double *)(in_RDI[local_5c] + (long)local_60 * 8) =
             local_48 /
             ((double)((bVar1 & 10) != 0) * dVar3 +
             (double)((bVar1 & 5) != 0) * dVar2 + (double)((bVar1 & 0xf) == 0));
      }
    }
  }
  return;
}

Assistant:

void applyPbndCond (REAL **P, lattice *grid, char **FLAG)
{
	/* Apply boundary conditions for the pressure field */
	char flag = 0;
	/* First set values on the actual boundary of the region */
	if (grid->edges & LEFT)
		for (int j = 1; j <= grid->delj; j++)
			P[0][j] = P[1][j];
	if (grid->edges & RIGHT)
		for (int j = 1; j <= grid->delj; j++)
			P[grid->deli+1][j] = P[grid->deli][j];
	if (grid->edges & BOTTOM)
		for (int i = 1; i <= grid->deli; i++)
			P[i][0] = P[i][1];
	if (grid->edges & TOP)
		for (int i = 1; i <= grid->deli; i++)
			P[i][grid->delj+1] = P[i][grid->delj];
	REAL dxSqrd = sqr(grid->delx);
	REAL dySqrd = sqr(grid->dely);
	REAL num, denom;
	int delNS, delOW;
	for (int i = 1; i <= grid->deli; i++)
		for (int j = 1; j <= grid->delj; j++)
		{
			flag = LO_NIBBLE(FLAG[i][j]);
			if (flag == C_F)
				continue;
			num = 0;
			denom = (flag == C_B) + ((flag & B_NS) != 0)*dxSqrd + ((flag & B_OW) != 0)*dySqrd;
			delNS = ((flag & B_N) != 0) - ((flag & B_S) != 0);
			delOW = ((flag & B_O) != 0) - ((flag & B_W) != 0);

			if (flag & B_NS)
				num += P[i][j+delNS] * dxSqrd;
			if (flag & B_OW)
				num += P[i+delOW][j] * dySqrd;

			P[i][j] = num / denom;
		}
	return;
}